

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementBackgroundBorder.cpp
# Opt level: O3

void __thiscall
Rml::ElementBackgroundBorder::GenerateGeometry(ElementBackgroundBorder *this,Element *element)

{
  ulong uVar1;
  uint uVar2;
  Colourb CVar3;
  Colourb CVar4;
  code *pcVar5;
  undefined1 auVar6 [12];
  pointer pBVar7;
  pointer pBVar8;
  pointer pBVar9;
  undefined1 auVar10 [8];
  bool bVar11;
  int iVar12;
  RenderManager *mesh_00;
  Element *element_00;
  Property *this_00;
  Background *this_01;
  ColourbPremultiplied background_color;
  uint uVar13;
  int i;
  int index;
  undefined1 auVar14 [16];
  undefined1 auVar16 [16];
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  CornerSizes border_radius;
  Mesh mesh;
  BoxShadowList *in_stack_fffffffffffffec8;
  vector<Rml::BoxShadow,_std::allocator<Rml::BoxShadow>_> local_118;
  ColourbPremultiplied local_f8;
  uint local_f4;
  uint local_f0;
  uint local_ec;
  ComputedValues *local_e0;
  ElementBackgroundBorder *local_d8;
  undefined1 local_d0 [16];
  pointer local_c0;
  Mesh local_b8;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  undefined1 local_60 [8];
  float local_58;
  undefined1 auVar15 [16];
  
  mesh_00 = Element::GetRenderManager(element);
  if (mesh_00 != (RenderManager *)0x0) {
    local_e0 = Element::GetComputedValues(element);
    uVar2 = *(uint *)&local_e0->rare;
    fVar20 = (local_e0->inherited).opacity;
    CVar3 = (local_e0->common).background_color;
    uVar13 = (uint)CVar3 >> 0x18;
    if (1.0 <= fVar20 || ((byte)(uVar2 >> 0x1c) & 1) != 0) {
      background_color =
           (ColourbPremultiplied)
           ((((uint)CVar3 >> 8 & 0xff) * uVar13 * 0x8081 >> 0xf & 0xff00) +
           (((uint)CVar3 >> 0x10 & 0xff) * uVar13 * 0x8081 >> 7 & 0x1ff0000) +
           ((uint)CVar3 & 0xff000000 | (((uint)CVar3 & 0xff) * uVar13) / 0xff));
      CVar3 = (local_e0->common).border_top_color;
      uVar13 = (uint)CVar3 >> 0x18;
      local_f8 = (ColourbPremultiplied)
                 ((((uint)CVar3 >> 8 & 0xff) * uVar13 * 0x8081 >> 0xf & 0xff00) +
                 (((uint)CVar3 >> 0x10 & 0xff) * uVar13 * 0x8081 >> 7 & 0x1ff0000) +
                 ((uint)CVar3 & 0xff000000 | (((uint)CVar3 & 0xff) * uVar13) / 0xff));
      CVar3 = (local_e0->common).border_right_color;
      uVar13 = (uint)CVar3 >> 0x18;
      local_f4 = (((uint)CVar3 >> 8 & 0xff) * uVar13 * 0x8081 >> 0xf & 0xff00) +
                 (((uint)CVar3 >> 0x10 & 0xff) * uVar13 * 0x8081 >> 7 & 0x1ff0000) +
                 ((uint)CVar3 & 0xff000000 | (((uint)CVar3 & 0xff) * uVar13) / 0xff);
      CVar3 = (local_e0->common).border_bottom_color;
      CVar4 = (local_e0->common).border_left_color;
      uVar13 = (uint)CVar3 >> 0x18;
      local_f0 = (((uint)CVar3 >> 8 & 0xff) * uVar13 * 0x8081 >> 0xf & 0xff00) +
                 (((uint)CVar3 >> 0x10 & 0xff) * uVar13 * 0x8081 >> 7 & 0x1ff0000) +
                 ((uint)CVar3 & 0xff000000 | (((uint)CVar3 & 0xff) * uVar13) / 0xff);
      uVar13 = (uint)CVar4 >> 0x18;
      local_ec = (((uint)CVar4 >> 8 & 0xff) * uVar13 * 0x8081 >> 0xf & 0xff00) +
                 (((uint)CVar4 >> 0x10 & 0xff) * uVar13 * 0x8081 >> 7 & 0x1ff0000) +
                 ((uint)CVar4 & 0xff000000 | (((uint)CVar4 & 0xff) * uVar13) / 0xff);
    }
    else {
      fVar17 = ((float)uVar13 * fVar20) / 255.0;
      CVar4 = (local_e0->common).border_top_color;
      fVar18 = (float)((uint)CVar4 >> 0x18) * fVar20;
      fVar19 = fVar18 / 255.0;
      background_color =
           (ColourbPremultiplied)
           ((int)((float)((uint)CVar3 & 0xff) * fVar17) & 0xffU |
           ((int)((float)((uint)CVar3 >> 8 & 0xff) * fVar17) & 0xffU) << 8 |
           ((int)((float)((uint)CVar3 >> 0x10 & 0xff) * fVar17) & 0xffU) << 0x10 |
           (int)((float)uVar13 * fVar20) << 0x18);
      local_f8 = (ColourbPremultiplied)
                 ((int)((float)((uint)CVar4 & 0xff) * fVar19) & 0xffU |
                 ((int)((float)((uint)CVar4 >> 8 & 0xff) * fVar19) & 0xffU) << 8 |
                 ((int)((float)((uint)CVar4 >> 0x10 & 0xff) * fVar19) & 0xffU) << 0x10 |
                 (int)fVar18 << 0x18);
      CVar3 = (local_e0->common).border_right_color;
      fVar17 = (float)((uint)CVar3 >> 0x18) * fVar20;
      fVar18 = fVar17 / 255.0;
      local_f4 = (int)((float)((uint)CVar3 & 0xff) * fVar18) & 0xffU |
                 ((int)((float)((uint)CVar3 >> 8 & 0xff) * fVar18) & 0xffU) << 8 |
                 ((int)((float)((uint)CVar3 >> 0x10 & 0xff) * fVar18) & 0xffU) << 0x10 |
                 (int)fVar17 << 0x18;
      CVar3 = (local_e0->common).border_bottom_color;
      fVar17 = (float)((uint)CVar3 >> 0x18) * fVar20;
      fVar18 = fVar17 / 255.0;
      CVar4 = (local_e0->common).border_left_color;
      local_f0 = (int)((float)((uint)CVar3 & 0xff) * fVar18) & 0xffU |
                 ((int)((float)((uint)CVar3 >> 8 & 0xff) * fVar18) & 0xffU) << 8 |
                 ((int)((float)((uint)CVar3 >> 0x10 & 0xff) * fVar18) & 0xffU) << 0x10 |
                 (int)fVar17 << 0x18;
      fVar20 = (float)((uint)CVar4 >> 0x18) * fVar20;
      fVar17 = fVar20 / 255.0;
      local_ec = (int)((float)((uint)CVar4 & 0xff) * fVar17) & 0xffU |
                 ((int)((float)((uint)CVar4 >> 8 & 0xff) * fVar17) & 0xffU) << 8 |
                 ((int)((float)((uint)CVar4 >> 0x10 & 0xff) * fVar17) & 0xffU) << 0x10 |
                 (int)fVar20 << 0x18;
    }
    uVar1._0_2_ = (local_e0->rare).border_top_left_radius;
    uVar1._2_2_ = (local_e0->rare).border_top_right_radius;
    uVar1._4_2_ = (local_e0->rare).border_bottom_right_radius;
    uVar1._6_2_ = (local_e0->rare).border_bottom_left_radius;
    auVar15._8_4_ = 0;
    auVar15._0_8_ = uVar1;
    auVar15._12_2_ = uVar1._6_2_;
    auVar15._14_2_ = uVar1._6_2_;
    auVar14._12_4_ = auVar15._12_4_;
    auVar14._8_2_ = 0;
    auVar14._0_8_ = uVar1;
    auVar14._10_2_ = uVar1._4_2_;
    auVar16._10_6_ = auVar14._10_6_;
    auVar16._8_2_ = uVar1._4_2_;
    auVar16._0_8_ = uVar1;
    auVar6._4_8_ = auVar16._8_8_;
    auVar6._2_2_ = uVar1._2_2_;
    auVar6._0_2_ = uVar1._2_2_;
    local_78 = (float)(int)(short)(undefined2)uVar1;
    fStack_74 = (float)(auVar6._0_4_ >> 0x10);
    fStack_70 = (float)(auVar16._8_4_ >> 0x10);
    fStack_6c = (float)(auVar14._12_4_ >> 0x10);
    uVar13._0_2_ = (local_e0->rare).border_bottom_right_radius;
    uVar13._2_2_ = (local_e0->rare).border_bottom_left_radius;
    auVar16 = pshuflw(ZEXT416(uVar13),ZEXT416(uVar13),0x60);
    local_88 = (float)(auVar16._0_4_ >> 0x10);
    fStack_84 = (float)(auVar16._4_4_ >> 0x10);
    fStack_80 = (float)(auVar16._8_4_ >> 0x10);
    fStack_7c = (float)(auVar16._12_4_ >> 0x10);
    index = 0;
    local_d8 = this;
    element_00 = (Element *)GetOrCreateBackground(this,BackgroundBorder);
    Geometry::Release(&local_b8,(Geometry *)element_00,ClearMesh);
    while( true ) {
      iVar12 = Element::GetNumBoxes(element);
      if (iVar12 <= index) break;
      Element::GetRenderBox((RenderBox *)local_60,element,Padding,index);
      MeshUtilities::GenerateBackgroundBorder
                (&local_b8,(RenderBox *)local_60,background_color,&local_f8);
      index = index + 1;
    }
    RenderManager::MakeGeometry((RenderManager *)local_60,(Mesh *)mesh_00);
    UniqueRenderResource<Rml::Geometry,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
    ::ReleaseInDerived((UniqueRenderResource<Rml::Geometry,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
                        *)element_00);
    fVar20 = local_58;
    auVar10 = local_60;
    local_60._0_4_ = 0.0;
    local_60._4_4_ = 0.0;
    (element_00->super_ScriptInterface).super_Releasable._vptr_Releasable = (_func_int **)auVar10;
    local_58 = -NAN;
    *(float *)&(element_00->super_EnableObserverPtr<Rml::Element>).block = fVar20;
    UniqueRenderResource<Rml::Geometry,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
    ::ReleaseInDerived((UniqueRenderResource<Rml::Geometry,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
                        *)local_60);
    if ((uVar2 >> 0x1c & 1) != 0) {
      this_00 = Element::GetLocalProperty(element,BoxShadow);
      if ((this_00->value).type != BOXSHADOWLIST) {
        bVar11 = Assert("RMLUI_ASSERT(p_box_shadow->value.GetType() == Variant::BOXSHADOWLIST)",
                        "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/ElementBackgroundBorder.cpp"
                        ,0xa3);
        if (!bVar11) {
          pcVar5 = (code *)invalidInstructionException();
          (*pcVar5)();
        }
      }
      local_118.super__Vector_base<Rml::BoxShadow,_std::allocator<Rml::BoxShadow>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_118.super__Vector_base<Rml::BoxShadow,_std::allocator<Rml::BoxShadow>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_118.super__Vector_base<Rml::BoxShadow,_std::allocator<Rml::BoxShadow>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      Variant::GetInto<std::vector<Rml::BoxShadow,_std::allocator<Rml::BoxShadow>_>,_0>
                (&this_00->value,&local_118);
      pBVar9 = local_118.super__Vector_base<Rml::BoxShadow,_std::allocator<Rml::BoxShadow>_>._M_impl
               .super__Vector_impl_data._M_end_of_storage;
      pBVar8 = local_118.super__Vector_base<Rml::BoxShadow,_std::allocator<Rml::BoxShadow>_>._M_impl
               .super__Vector_impl_data._M_finish;
      pBVar7 = local_118.super__Vector_base<Rml::BoxShadow,_std::allocator<Rml::BoxShadow>_>._M_impl
               .super__Vector_impl_data._M_start;
      local_118.super__Vector_base<Rml::BoxShadow,_std::allocator<Rml::BoxShadow>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_118.super__Vector_base<Rml::BoxShadow,_std::allocator<Rml::BoxShadow>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_118.super__Vector_base<Rml::BoxShadow,_std::allocator<Rml::BoxShadow>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      this_01 = GetOrCreateBackground(local_d8,BoxShadow);
      local_d0._0_8_ = pBVar7;
      local_d0._8_8_ = pBVar8;
      local_c0 = pBVar9;
      border_radius._M_elems[1] = fStack_74;
      border_radius._M_elems[0] = local_78;
      border_radius._M_elems[3] = fStack_84;
      border_radius._M_elems[2] = local_88;
      GeometryBoxShadow::Generate
                ((GeometryBoxShadow *)this_01,(Geometry *)&this_01->texture,
                 (CallbackTexture *)mesh_00,(RenderManager *)element,element_00,(Geometry *)local_d0
                 ,in_stack_fffffffffffffec8,border_radius,(local_e0->inherited).opacity);
      if ((RenderManager *)local_d0._0_8_ != (RenderManager *)0x0) {
        operator_delete((void *)local_d0._0_8_,(long)local_c0 - local_d0._0_8_);
      }
    }
    if (local_b8.indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_b8.indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_b8.indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_b8.indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_b8.vertices.super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_b8.vertices.
                      super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_b8.vertices.
                            super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_b8.vertices.
                            super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

void ElementBackgroundBorder::GenerateGeometry(Element* element)
{
	RenderManager* render_manager = element->GetRenderManager();
	if (!render_manager)
		return;

	const ComputedValues& computed = element->GetComputedValues();
	const bool has_box_shadow = computed.has_box_shadow();
	const float opacity = computed.opacity();

	// Apply opacity except if we have a box shadow. In the latter case the background is rendered opaquely into the box-shadow texture, while
	// opacity is applied to the entire box-shadow texture when that is rendered.
	bool apply_opacity = (!has_box_shadow && opacity < 1.f);

	auto ConvertColor = [=](Colourb color) {
		if (apply_opacity)
			return color.ToPremultiplied(opacity);
		else
			return color.ToPremultiplied();
	};

	ColourbPremultiplied background_color = ConvertColor(computed.background_color());
	ColourbPremultiplied border_colors[4] = {
		ConvertColor(computed.border_top_color()),
		ConvertColor(computed.border_right_color()),
		ConvertColor(computed.border_bottom_color()),
		ConvertColor(computed.border_left_color()),
	};
	const CornerSizes border_radius = computed.border_radius();

	Geometry& geometry = GetOrCreateBackground(BackgroundType::BackgroundBorder).geometry;
	Mesh mesh = geometry.Release(Geometry::ReleaseMode::ClearMesh);

	for (int i = 0; i < element->GetNumBoxes(); i++)
		MeshUtilities::GenerateBackgroundBorder(mesh, element->GetRenderBox(BoxArea::Padding, i), background_color, border_colors);

	geometry = render_manager->MakeGeometry(std::move(mesh));

	if (has_box_shadow)
	{
		Geometry& background_border_geometry = geometry;

		const Property* p_box_shadow = element->GetLocalProperty(PropertyId::BoxShadow);
		RMLUI_ASSERT(p_box_shadow->value.GetType() == Variant::BOXSHADOWLIST);
		BoxShadowList shadow_list = p_box_shadow->value.Get<BoxShadowList>();

		// Generate the geometry for the box-shadow texture.
		Background& shadow_background = GetOrCreateBackground(BackgroundType::BoxShadow);
		Geometry& shadow_geometry = shadow_background.geometry;
		CallbackTexture& shadow_texture = shadow_background.texture;

		GeometryBoxShadow::Generate(shadow_geometry, shadow_texture, *render_manager, element, background_border_geometry, std::move(shadow_list),
			border_radius, computed.opacity());
	}
}